

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O3

int ProgramMain(int argc,char **argv)

{
  pointer *ppMVar1;
  pointer pIVar2;
  ExternType *pEVar3;
  void *pvVar4;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> *puVar5;
  long this;
  unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> uVar6;
  undefined1 auVar7 [8];
  undefined8 this_00;
  Result RVar8;
  int iVar9;
  wabt *this_01;
  interp *this_02;
  pointer __dest;
  Ref module;
  Callback *callback;
  uint uVar10;
  string *psVar11;
  undefined8 uVar12;
  Store *errors_00;
  char *pcVar13;
  ulong uVar14;
  size_t __n;
  pointer pIVar15;
  bool bVar16;
  string_view filename;
  string_view filename_00;
  RefVec imports;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  OptionParser parser;
  Errors errors;
  FuncType func_type;
  ModuleDesc *in_stack_fffffffffffffc80;
  vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> local_378;
  pointer local_360;
  string local_358;
  RefPtr<wabt::interp::Module> local_338;
  _Any_data local_318;
  vector<wabt::Type,_std::allocator<wabt::Type>_> vStack_308;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_2f0;
  undefined1 local_2d8 [8];
  Store *pSStack_2d0;
  undefined1 local_2c8 [8];
  undefined1 local_2c0 [16];
  undefined **local_2b0;
  undefined1 local_2a8 [16];
  undefined1 auStack_298 [16];
  undefined1 local_288 [16];
  vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_> local_278;
  vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_> local_260;
  vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_> vStack_248;
  vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_> vStack_230;
  vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_> vStack_218;
  vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> vStack_200;
  vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_> vStack_1e8;
  Istream local_1d0;
  tuple<wabt::FileStream_*,_std::default_delete<wabt::FileStream>_> local_1b0;
  _Any_data local_1a8;
  code *pcStack_198;
  code *local_190;
  undefined1 local_188 [16];
  pointer local_178;
  RefPtr<wabt::interp::HostFunc> local_170;
  _Any_data local_158;
  undefined1 local_148 [8];
  vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_> local_140;
  vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_> local_128;
  vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_> local_110;
  vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_> local_f8;
  vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_> local_e0;
  vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_> local_c8;
  vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_> local_b0;
  vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_> local_98;
  vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> local_80;
  vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_> vStack_68;
  pointer local_50;
  pointer puStack_48;
  pointer local_40;
  
  wabt::InitStdio();
  wabt::FileStream::CreateStdout();
  auVar7 = local_2d8;
  uVar6 = s_stdout_stream;
  local_2d8 = (undefined1  [8])0x0;
  s_stdout_stream._M_t.
  super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)auVar7;
  if (((__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
       uVar6._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
       _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
       super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)0x0) &&
     ((**(code **)(*(long *)uVar6._M_t.
                            super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                            .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl + 8))(),
     local_2d8 != (undefined1  [8])0x0)) {
    (**(code **)(*(long *)local_2d8 + 8))();
  }
  wabt::FileStream::CreateStderr();
  auVar7 = local_2d8;
  uVar6 = s_stderr_stream;
  local_2d8 = (undefined1  [8])0x0;
  s_stderr_stream._M_t.
  super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)auVar7;
  if (((__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
       uVar6._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
       _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
       super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)0x0) &&
     ((**(code **)(*(long *)uVar6._M_t.
                            super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                            .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl + 8))(),
     local_2d8 != (undefined1  [8])0x0)) {
    (**(code **)(*(long *)local_2d8 + 8))();
  }
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_2d8,"wasm-interp",
             "  read a file in the wasm binary format, and run in it a stack-based\n  interpreter.\n\nexamples:\n  # parse binary file test.wasm, and type-check it\n  $ wasm-interp test.wasm\n\n  # parse test.wasm and run all its exported functions\n  $ wasm-interp test.wasm --run-all-exports\n\n  # parse test.wasm, run the exported functions and trace the output\n  $ wasm-interp test.wasm --run-all-exports --trace\n\n  # parse test.wasm and run all its exported functions, setting the\n  # value stack size to 100 elements\n  $ wasm-interp test.wasm -V 100 --run-all-exports\n\n  # parse test.wasm, run specific exported function by name with argument\n  $ wasm-interp test.wasm -r \"func_sum\" -a \"i32:8\" -a \"i32:5\"\n"
            );
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:139:72)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:139:72)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2d8,'v',"verbose","Use multiple times for more info",
             (NullCallback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  wabt::Features::AddOptions(&s_features,(OptionParser *)local_2d8);
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:146:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:146:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2d8,'V',"value-stack-size","SIZE",
             "Size in elements of the value stack",(Callback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:152:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:152:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2d8,'C',"call-stack-size","SIZE",
             "Size in elements of the call stack",(Callback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:157:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:157:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2d8,'t',"trace","Trace execution",(NullCallback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:160:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:160:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2d8,'r',"run-export","FUNCTION","Run exported function by name",
             (Callback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:167:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:167:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2d8,'a',"argument","ARGUMENT",
             "Add argument to an exported function execution",(Callback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:181:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:181:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2d8,"wasi",
             "Assume input module is WASI compliant (Export  WASI API the the module and invoke _start function)"
             ,(NullCallback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:185:7)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:185:7)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2d8,'e',"env","ENV",
             "Pass the given environment string in the WASI runtime",(Callback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:188:7)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:188:7)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2d8,'d',"dir","DIR",
             "Pass the given directory the the WASI runtime",(Callback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:192:7)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:192:7)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2d8,"run-all-exports",
             "Run all the exported functions, in order. Useful for testing",
             (NullCallback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:196:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:196:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2d8,"host-print",
             "Include an importable function named \"host.print\" for printing to stdout",
             (NullCallback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:201:7)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:201:7)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2d8,"dummy-import-func",
             "Provide a dummy implementation of all imported functions. The function will log the call and return an appropriate zero value."
             ,(NullCallback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_148 = (undefined1  [8])0x656d616e656c6966;
  local_158._8_8_ = 8;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_140.
                        super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_318._M_unused._M_object = (void *)0x0;
  local_318._8_4_ = 0;
  local_318._12_4_ = 0;
  vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:204:22)>
                ::_M_invoke;
  vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start._0_3_ = 0x111dd6;
  vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start._3_5_ = 0;
  local_158._M_unused._M_object = local_148;
  wabt::OptionParser::AddArgument
            ((OptionParser *)local_2d8,(string *)&local_158,One,(Callback *)&local_318);
  if ((code *)CONCAT53(vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._3_5_,
                       vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_3_) != (code *)0x0) {
    (*(code *)CONCAT53(vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._3_5_,
                       vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_3_))(&local_318,&local_318,3);
  }
  if ((undefined1 *)local_158._M_unused._0_8_ != local_148) {
    operator_delete(local_158._M_unused._M_object,(ulong)((long)local_148 + 1));
  }
  local_148._0_4_ = 0x677261;
  local_158._8_8_ = (Store *)0x3;
  callback = (Callback *)&local_318;
  local_318._M_unused._M_object = (undefined **)0x0;
  local_318._8_4_ = 0;
  local_318._12_4_ = 0;
  vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:207:7)>
                ::_M_invoke;
  vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start._0_3_ = 0x111e38;
  vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start._3_5_ = 0;
  local_158._M_unused._M_object = local_148;
  wabt::OptionParser::AddArgument
            ((OptionParser *)local_2d8,(string *)&local_158,ZeroOrMore,callback);
  if ((code *)CONCAT53(vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._3_5_,
                       vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_3_) != (code *)0x0) {
    (*(code *)CONCAT53(vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._3_5_,
                       vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_3_))(&local_318,&local_318,3);
  }
  if ((undefined1 *)local_158._M_unused._0_8_ != local_148) {
    operator_delete(local_158._M_unused._M_object,(ulong)((long)local_148 + 1));
  }
  wabt::OptionParser::Parse((OptionParser *)local_2d8,argc,argv);
  if (local_260.
      super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    ppMVar1 = &local_278.
               super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (*(code *)local_260.
              super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
              ._M_impl.super__Vector_impl_data._M_finish)(ppMVar1,ppMVar1,3);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            ((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
             (local_288 + 8));
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
             auStack_298);
  if ((undefined1 *)local_2c0._8_8_ != local_2a8) {
    operator_delete((void *)local_2c0._8_8_,CONCAT44(local_2a8._4_4_,local_2a8._0_4_) + 1);
  }
  if (local_2d8 != (undefined1  [8])local_2c8) {
    operator_delete((void *)local_2d8,(ulong)((long)local_2c8 + 1));
  }
  pcVar13 = s_infile;
  uVar6._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       s_stdout_stream._M_t.
       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
       super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
  s_store.features_.exceptions_enabled_ = s_features.exceptions_enabled_;
  s_store.features_.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
  s_store.features_.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
  s_store.features_.sign_extension_enabled_ = s_features.sign_extension_enabled_;
  s_store.features_.simd_enabled_ = s_features.simd_enabled_;
  s_store.features_.threads_enabled_ = s_features.threads_enabled_;
  s_store.features_.function_references_enabled_ = s_features.function_references_enabled_;
  s_store.features_.multi_value_enabled_ = s_features.multi_value_enabled_;
  s_store.features_.tail_call_enabled_ = s_features.tail_call_enabled_;
  s_store.features_.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
  s_store.features_.reference_types_enabled_ = s_features.reference_types_enabled_;
  s_store.features_.annotations_enabled_ = s_features.annotations_enabled_;
  s_store.features_.code_metadata_enabled_ = s_features.code_metadata_enabled_;
  s_store.features_.gc_enabled_ = s_features.gc_enabled_;
  s_store.features_.memory64_enabled_ = s_features.memory64_enabled_;
  s_store.features_.multi_memory_enabled_ = s_features.multi_memory_enabled_;
  s_store.features_.extended_const_enabled_ = s_features.extended_const_enabled_;
  s_store.features_.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
  s_store.features_.custom_page_sizes_enabled_ = s_features.custom_page_sizes_enabled_;
  uVar12 = (Module *)0x0;
  local_178 = (pointer)0x0;
  local_188._0_8_ = (pointer)0x0;
  local_188._8_8_ = (pointer)0x0;
  local_338.root_index_ = 0;
  local_338.obj_ = (Module *)0x0;
  local_338.store_ = (Store *)0x0;
  local_358.field_2._M_allocated_capacity = 0;
  local_358._M_dataplus._M_p = (char *)0x0;
  local_358._M_string_length = 0;
  this_01 = (wabt *)strlen(s_infile);
  filename._M_str = (char *)&local_358;
  filename._M_len = (size_t)pcVar13;
  RVar8 = wabt::ReadFile(this_01,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  bVar16 = false;
  if (RVar8.enum_ != Error) {
    uVar12 = (Module *)0x0;
    memset((OptionParser *)local_2d8,0,0x120);
    local_318._M_unused._M_object = (void *)s_features._0_8_;
    local_318._8_4_ = s_features._8_4_;
    local_318._M_pod_data[0xf] = s_features.multi_memory_enabled_;
    local_318._12_3_ = s_features._12_3_;
    vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start._0_3_ = s_features._16_3_;
    vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)s_log_stream._M_t.
                  super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                  .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0x10101;
    this_02 = (interp *)strlen(pcVar13);
    filename_00._M_str = local_358._M_dataplus._M_p;
    filename_00._M_len = (size_t)pcVar13;
    RVar8 = wabt::interp::ReadBinaryInterp
                      (this_02,filename_00,
                       (void *)(local_358._M_string_length - (long)local_358._M_dataplus._M_p),
                       (size_t)&local_318,(ReadBinaryOptions *)local_188,(Errors *)local_2d8,
                       in_stack_fffffffffffffc80);
    bVar16 = RVar8.enum_ != Error;
    if (bVar16) {
      if (s_verbose != 0) {
        wabt::interp::Istream::Disassemble
                  (&local_1d0,
                   (Stream *)
                   uVar6._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl);
      }
      std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::vector
                ((vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_> *)
                 &local_158,
                 (vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_> *)
                 local_2d8);
      std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::vector
                ((vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_> *)
                 (local_148 + 8),
                 (vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_> *)
                 local_2c0);
      std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::vector
                (&local_128,
                 (vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_> *)
                 local_2a8);
      std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::vector
                (&local_110,
                 (vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_> *)
                 (auStack_298 + 8));
      std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::vector
                (&local_f8,&local_278);
      std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::vector
                (&local_e0,&local_260);
      std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>::vector
                (&local_c8,&vStack_248);
      std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::vector
                (&local_b0,&vStack_230);
      std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::vector
                (&local_98,&vStack_218);
      std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::vector
                (&local_80,&vStack_200);
      std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::vector
                (&vStack_68,&vStack_1e8);
      local_50 = (pointer)0x0;
      puStack_48 = (pointer)0x0;
      local_40 = (pointer)0x0;
      uVar14 = (long)local_1d0.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1d0.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar14 == 0) {
        __dest = (pointer)0x0;
        __n = 0;
      }
      else {
        if ((long)uVar14 < 0) {
          std::__throw_bad_alloc();
        }
        __dest = (pointer)operator_new(uVar14);
        __n = (long)local_1d0.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1d0.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      local_40 = __dest + uVar14;
      local_50 = __dest;
      if (local_1d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        puStack_48 = __dest;
        memmove(__dest,local_1d0.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,__n);
      }
      puStack_48 = __dest + __n;
      wabt::interp::Store::Alloc<wabt::interp::Module,wabt::interp::Store&,wabt::interp::ModuleDesc>
                ((RefPtr<wabt::interp::Module> *)&local_1a8,&s_store,&s_store,
                 (ModuleDesc *)&local_158);
      uVar12 = local_1a8._M_unused._0_8_;
      local_338.obj_ = (Module *)local_1a8._M_unused._0_8_;
      local_338.store_ = (Store *)local_1a8._8_8_;
      local_338.root_index_ = (Index)pcStack_198;
      local_1a8._M_unused._M_object = (undefined8 *)0x0;
      local_1a8._8_8_ = (Store *)0x0;
      pcStack_198 = (code *)0x0;
      wabt::interp::ModuleDesc::~ModuleDesc((ModuleDesc *)&local_158);
    }
    wabt::interp::ModuleDesc::~ModuleDesc((ModuleDesc *)local_2d8);
  }
  if (local_358._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_358._M_dataplus._M_p,
                    local_358.field_2._M_allocated_capacity - (long)local_358._M_dataplus._M_p);
  }
  if (bVar16) {
    local_378.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_378.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_finish = (Ref *)0x0;
    local_378.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (Ref *)0x0;
    if (s_wasi == '\x01') {
      wabt::Stream::Writef
                ((Stream *)
                 s_stderr_stream._M_t.
                 super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
                 super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                 "wasi support not compiled in\n");
      uVar10 = 1;
    }
    else {
      pIVar2 = (((Module *)uVar12)->desc_).imports.
               super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar15 = (((Module *)uVar12)->desc_).imports.
                super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar2 != pIVar15) {
        local_1b0.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
        .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
             (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
             s_stdout_stream._M_t.
             super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
             super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
             super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
        psVar11 = &(pIVar2->type).name;
        local_360 = pIVar15;
        do {
          if ((((((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                   *)(psVar11 + 1))->_M_t).
                super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                ._M_t.
                super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->kind ==
               First) &&
             ((((s_host_print == '\x01' &&
                (iVar9 = std::__cxx11::string::compare((char *)(psVar11 + -1)), iVar9 == 0)) &&
               (iVar9 = std::__cxx11::string::compare((char *)psVar11), iVar9 == 0)) ||
              (s_dummy_import_func == '\x01')))) {
            pEVar3 = (((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                        *)(psVar11 + 1))->_M_t).
                     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
            if (pEVar3->kind != First) {
              __assert_fail("isa<Derived>(base)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                            ,0x4e,
                            "Derived *wabt::cast(Base *) [Derived = wabt::interp::FuncType, Base = wabt::interp::ExternType]"
                           );
            }
            local_158._8_8_ = local_158._8_8_ & 0xffffffff00000000;
            local_158._M_unused._M_object = &PTR__FuncType_001840c0;
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_148,
                       (vector<wabt::Type,_std::allocator<wabt::Type>_> *)(pEVar3 + 1));
            this = (long)&local_140.
                          super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)this,
                       (vector<wabt::Type,_std::allocator<wabt::Type>_> *)&pEVar3[2].kind);
            wabt::StringPrintf_abi_cxx11_
                      (&local_358,"%s.%s",(((ImportType *)(psVar11 + -1))->module)._M_dataplus._M_p,
                       (psVar11->_M_dataplus)._M_p);
            local_318._8_4_ = local_158._8_4_;
            local_318._M_unused._M_object = &PTR__FuncType_001840c0;
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      (&vStack_308,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_148);
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      (&local_2f0,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)this);
            local_2d8 = (undefined1  [8])
                        local_1b0.
                        super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                        .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
            pSStack_2d0 = (Store *)local_2c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pSStack_2d0,local_358._M_dataplus._M_p,
                       local_358._M_dataplus._M_p + local_358._M_string_length);
            local_2a8._0_4_ = local_158._8_4_;
            local_2b0 = &PTR__FuncType_001840c0;
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_2a8 + 8),
                       (vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_148);
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_288,
                       (vector<wabt::Type,_std::allocator<wabt::Type>_> *)
                       &local_140.
                        super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_1a8._8_8_ = (Store *)0x0;
            local_1a8._M_unused._M_object = operator_new(0x68);
            pIVar15 = local_360;
            *(undefined1 (*) [8])local_1a8._M_unused._0_8_ = local_2d8;
            *(code **)((long)local_1a8._M_unused._0_8_ + 8) =
                 (code *)((long)local_1a8._M_unused._0_8_ + 0x18);
            if (pSStack_2d0 == (Store *)local_2c0) {
              *(ulong *)((long)local_1a8._M_unused._0_8_ + 0x18) =
                   CONCAT71(local_2c0._1_7_,local_2c0[0]);
              *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x20) = local_2c0._8_8_;
            }
            else {
              *(Store **)((long)local_1a8._M_unused._0_8_ + 8) = pSStack_2d0;
              *(ulong *)((long)local_1a8._M_unused._0_8_ + 0x18) =
                   CONCAT71(local_2c0._1_7_,local_2c0[0]);
            }
            *(undefined1 (*) [8])((long)local_1a8._M_unused._0_8_ + 0x10) = local_2c8;
            local_2c8 = (undefined1  [8])0x0;
            local_2c0[0] = '\0';
            *(undefined4 *)((long)local_1a8._M_unused._0_8_ + 0x30) = local_2a8._0_4_;
            *(undefined ***)((long)local_1a8._M_unused._0_8_ + 0x28) = &PTR__FuncType_001840c0;
            *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x38) = local_2a8._8_8_;
            *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x40) = auStack_298._0_8_;
            *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x48) = auStack_298._8_8_;
            auStack_298._8_8_ = (pointer)0x0;
            local_2a8._8_8_ = (void *)0x0;
            auStack_298._0_8_ = (pointer)0x0;
            *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x50) = local_288._0_8_;
            *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x58) = local_288._8_8_;
            *(pointer *)((long)local_1a8._M_unused._0_8_ + 0x60) =
                 local_278.
                 super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_278.
            super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_288._0_8_ = (pointer)0x0;
            local_288._8_8_ = (pointer)0x0;
            local_190 = std::
                        _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:295:11)>
                        ::_M_invoke;
            pcStack_198 = std::
                          _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:295:11)>
                          ::_M_manager;
            pSStack_2d0 = (Store *)local_2c0;
            wabt::interp::Store::
            Alloc<wabt::interp::HostFunc,wabt::interp::Store&,wabt::interp::FuncType&,std::function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>&>
                      (&local_170,&s_store,&s_store,(FuncType *)&local_318,
                       (function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
                        *)&local_1a8);
            if (pcStack_198 != (code *)0x0) {
              (*pcStack_198)(&local_1a8,&local_1a8,__destroy_functor);
            }
            local_2b0 = &PTR__FuncType_001840c0;
            if ((pointer)local_288._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_288._0_8_,
                              (long)local_278.
                                    super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
                                    ._M_impl.super__Vector_impl_data._M_start - local_288._0_8_);
            }
            if ((void *)local_2a8._8_8_ != (void *)0x0) {
              operator_delete((void *)local_2a8._8_8_,auStack_298._8_8_ - local_2a8._8_8_);
            }
            if (pSStack_2d0 != (Store *)local_2c0) {
              operator_delete(pSStack_2d0,CONCAT71(local_2c0._1_7_,local_2c0[0]) + 1);
            }
            local_318._M_unused._M_object = &PTR__FuncType_001840c0;
            if (local_2f0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2f0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_2f0.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_2f0.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            pvVar4 = (void *)CONCAT53(vStack_308.
                                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                      _M_impl.super__Vector_impl_data._M_start._3_5_,
                                      vStack_308.
                                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                      _M_impl.super__Vector_impl_data._M_start._0_3_);
            if (pvVar4 != (void *)0x0) {
              operator_delete(pvVar4,CONCAT44(vStack_308.
                                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _4_4_,vStack_308.
                                                                                                        
                                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_) - (long)pvVar4);
            }
            local_2d8 = (undefined1  [8])
                        wabt::interp::RefPtr<wabt::interp::HostFunc>::ref(&local_170);
            if (local_378.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_378.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
              _M_realloc_insert<wabt::interp::Ref>
                        (&local_378,
                         (iterator)
                         local_378.
                         super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Ref *)local_2d8);
            }
            else {
              (local_378.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
               _M_impl.super__Vector_impl_data._M_finish)->index = (size_t)local_2d8;
              local_378.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_378.
                   super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            if (local_170.obj_ != (HostFunc *)0x0) {
              wabt::interp::Store::DeleteRoot(local_170.store_,local_170.root_index_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
            }
            local_158._M_unused._M_object = &PTR__FuncType_001840c0;
            if (local_140.
                super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              operator_delete(local_140.
                              super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)local_128.
                                    super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_140.
                                    super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            if (local_148 != (undefined1  [8])0x0) {
              operator_delete((void *)local_148,
                              (long)local_140.
                                    super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)local_148);
            }
          }
          else if (local_378.
                   super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl
                   .super__Vector_impl_data._M_finish ==
                   local_378.
                   super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage) {
            std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
            _M_realloc_insert<wabt::interp::Ref_const&>
                      ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)&local_378,
                       (iterator)
                       local_378.
                       super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(Ref *)&wabt::interp::Ref::Null);
          }
          else {
            (local_378.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
             _M_impl.super__Vector_impl_data._M_finish)->index = 0;
            local_378.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_378.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          puVar5 = (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                    *)(psVar11 + 1);
          psVar11 = (string *)((long)(psVar11 + 2) + 8);
        } while ((pointer)(puVar5 + 1) != pIVar15);
      }
      local_2d8 = (undefined1  [8])0x0;
      pSStack_2d0 = (Store *)0x0;
      local_2c8 = (undefined1  [8])0x0;
      module = wabt::interp::RefPtr<wabt::interp::Module>::ref(&local_338);
      errors_00 = &s_store;
      wabt::interp::Instance::Instantiate
                ((Ptr *)&local_158,&s_store,module,&local_378,(Ptr *)local_2d8);
      auVar7 = local_148;
      this_00 = local_158._8_8_;
      uVar12 = local_158._M_unused._0_8_;
      local_318._M_unused._M_object = local_158._M_unused._M_object;
      local_318._8_4_ = (undefined4)local_158._8_8_;
      local_318._12_4_ = (undefined4)((ulong)local_158._8_8_ >> 0x20);
      vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start._0_3_ = local_148._0_3_;
      vStack_308.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start._3_5_ = local_148._3_5_;
      if ((undefined **)local_158._M_unused._0_8_ == (undefined **)0x0) {
        pcVar13 = "error initializing module";
        wabt::interp::WriteTrap
                  ((Stream *)
                   s_stderr_stream._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                   "error initializing module",(Ptr *)local_2d8);
        errors_00 = (Store *)pcVar13;
      }
      if (local_2d8 != (undefined1  [8])0x0) {
        errors_00 = (Store *)local_2c8;
        wabt::interp::Store::DeleteRoot(pSStack_2d0,(Index)local_2c8);
      }
      if ((undefined **)uVar12 != (undefined **)0x0) {
        if (s_run_all_exports == '\x01') {
          RunAllExports((Ptr *)&local_318,(Errors *)errors_00);
        }
        if (s_run_exports.super__Vector_base<FunctionCall,_std::allocator<FunctionCall>_>._M_impl.
            super__Vector_impl_data._M_start !=
            s_run_exports.super__Vector_base<FunctionCall,_std::allocator<FunctionCall>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          RunSpecificExports((Ptr *)&local_318,(Errors *)errors_00,&s_run_exports);
        }
        wabt::interp::Store::DeleteRoot((Store *)this_00,(Index)auVar7);
      }
      uVar10 = (uint)((undefined **)uVar12 == (undefined **)0x0);
    }
    uVar12 = local_338.obj_;
    if (local_378.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_378.
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_378.
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_378.
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar12 = local_338.obj_;
    }
  }
  else {
    pSStack_2d0 = (Store *)0x0;
    local_2c8 = (undefined1  [8])((ulong)local_2c8 & 0xffffffffffffff00);
    uVar10 = 1;
    local_2d8 = (undefined1  [8])local_2c8;
    wabt::FormatErrorsToFile
              ((Errors *)local_188,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)local_2d8,
               Never,0x50);
    if (local_2d8 != (undefined1  [8])local_2c8) {
      operator_delete((void *)local_2d8,(ulong)((long)local_2c8 + 1));
    }
  }
  if ((Module *)uVar12 != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot(local_338.store_,local_338.root_index_);
  }
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)local_188);
  return uVar10;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();
  s_stdout_stream = FileStream::CreateStdout();
  s_stderr_stream = FileStream::CreateStderr();

  ParseOptions(argc, argv);
  s_store.setFeatures(s_features);

  wabt::Result result = ReadAndRunModule(s_infile);
  return result != wabt::Result::Ok;
}